

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-attitude-trajectory-reconstruction.hxx
# Opt level: O1

examples * __thiscall
stateObservation::examples::imuAttitudeTrajectoryReconstruction
          (examples *this,IndexedMatrixArray *y,Vector *xh0,Matrix *p,Matrix *q,Matrix *r,double dt)

{
  long lVar1;
  uint k;
  IndexedMatrixArray u;
  undefined8 local_b8 [2];
  undefined8 local_a8;
  void *local_a0 [3];
  IndexedMatrixArray local_88 [8];
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_80 [80];
  
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_88);
  k = 0xffffffff;
  if ((*(long *)(y + 0x38) - *(long *)(y + 0x40) >> 3) * -0x5555555555555555 +
      ((*(long *)(y + 0x50) - *(long *)(y + 0x30) >> 3) + -1 + (ulong)(*(long *)(y + 0x50) == 0)) *
      0x15 != (*(long *)(y + 0x28) - *(long *)(y + 0x18) >> 3) * 0x5555555555555555) {
    k = *(int *)y - 1;
  }
  for (; (lVar1 = (*(long *)(y + 0x28) - *(long *)(y + 0x18) >> 3) * -0x5555555555555555 +
                  (*(long *)(y + 0x38) - *(long *)(y + 0x40) >> 3) * -0x5555555555555555 +
                  ((*(long *)(y + 0x50) - *(long *)(y + 0x30) >> 3) + -1 +
                  (ulong)(*(long *)(y + 0x50) == 0)) * 0x15, lVar1 != 0 &&
         (k < ((int)lVar1 + *(int *)y) - 1U)); k = k + 1) {
    local_b8[0] = 6;
    local_a8 = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_a0,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_b8);
    IndexedMatrixArray::setValue(local_88,(Matrix *)local_a0,k);
    free(local_a0[0]);
  }
  imuAttitudeTrajectoryReconstruction(this,y,local_88,xh0,p,q,r,dt);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_80);
  return this;
}

Assistant:

IndexedMatrixArray imuAttitudeTrajectoryReconstruction(
    const IndexedMatrixArray & y,
    const Vector & xh0,
    const Matrix & p,
    const Matrix & q,
    const Matrix & r,
    double dt)
{
    const unsigned inputSize=6;

    ///initialization of a zero input
    IndexedMatrixArray u;
    for (unsigned k=y.getFirstIndex()-1; k<y.getLastIndex(); ++k)
    {
        u.setValue(Vector::Zero(inputSize,1),k);
    }

    return imuAttitudeTrajectoryReconstruction (y, u, xh0, p, q, r, dt);
}